

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

Expression *
slang::ast::Expression::bindLValue
          (ExpressionSyntax *lhs,Type *rhs,SourceLocation location,ASTContext *context,bool isInout)

{
  SourceRange sourceRange;
  byte bVar1;
  bool bVar2;
  SourceLocation SVar3;
  SourceLocation SVar4;
  _Optional_payload_base<slang::ast::BinaryOperator> op;
  Expression *pEVar5;
  ASTContext *in_RCX;
  SourceLocation in_RDX;
  Expression **in_RDI;
  byte in_R8B;
  Type *in_stack_00000008;
  ASTContext *in_stack_00000010;
  ExpressionSyntax *in_stack_00000018;
  Compilation *in_stack_00000020;
  bitmask<slang::ast::ASTFlags> in_stack_00000028;
  SourceRange lhsRange;
  bitmask<slang::ast::ASTFlags> astFlags;
  bitmask<slang::ast::AssignFlags> assignFlags;
  bitmask<slang::ast::ASTFlags> astFlags_1;
  Expression *lhsExpr;
  InstanceSymbolBase *instance;
  EmptyArgumentExpression *rhsExpr;
  Compilation *comp;
  ASTFlags in_stack_fffffffffffffe50;
  ASTContext *in_stack_fffffffffffffe58;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffe60;
  Compilation *in_stack_fffffffffffffe68;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffe70;
  ASTContext *in_stack_fffffffffffffea0;
  optional<slang::ast::BinaryOperator> local_c8;
  SourceRange local_c0;
  bitmask<slang::ast::ASTFlags> local_b0;
  bitmask<slang::ast::ASTFlags> local_a8;
  bitmask<slang::ast::ASTFlags> local_a0;
  bitmask<slang::ast::AssignFlags> local_93;
  bitmask<slang::ast::AssignFlags> local_92;
  bitmask<slang::ast::AssignFlags> local_91;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff70;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff78;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff80;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff88;
  bitmask<slang::ast::AssignFlags> flags;
  SourceRange in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffd0;
  
  bVar1 = in_R8B & 1;
  SVar3 = (SourceLocation)ASTContext::getCompilation((ASTContext *)0x60ba91);
  SourceRange::SourceRange((SourceRange *)&stack0xffffffffffffffb0,in_RDX,in_RDX);
  SVar4 = (SourceLocation)
          BumpAllocator::
          emplace<slang::ast::EmptyArgumentExpression,slang::ast::Type_const&,slang::SourceRange>
                    ((BumpAllocator *)in_stack_fffffffffffffe70.m_bits,
                     (Type *)in_stack_fffffffffffffe68,
                     (SourceRange *)in_stack_fffffffffffffe60.m_bits);
  op = (_Optional_payload_base<slang::ast::BinaryOperator>)ASTContext::getInstance(in_RCX);
  if (((*(int *)in_RDI == 0x1bb) && ((bVar1 & 1) == 0)) &&
     ((op == (_Optional_payload_base<slang::ast::BinaryOperator>)0x0 ||
      (bVar2 = std::span<const_unsigned_int,_18446744073709551615UL>::empty
                         ((span<const_unsigned_int,_18446744073709551615UL> *)0x60bb68), bVar2)))) {
    in_RCX = in_stack_fffffffffffffea0;
    in_stack_ffffffffffffff88 =
         ast::operator|((ASTFlags)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    pEVar5 = selfDetermined(in_stack_fffffffffffffe68,
                            (ExpressionSyntax *)in_stack_fffffffffffffe60.m_bits,
                            in_stack_fffffffffffffe58,in_stack_fffffffffffffe70);
    flags.m_bits = (underlying_type)((ulong)pEVar5 >> 0x38);
  }
  else {
    bitmask<slang::ast::ASTFlags>::bitmask
              ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffff80,LValue);
    in_stack_ffffffffffffff70.m_bits = in_stack_ffffffffffffff80.m_bits;
    if ((bVar1 & 1) != 0) {
      bitmask<slang::ast::ASTFlags>::bitmask
                ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffff78,LAndRValue);
      bitmask<slang::ast::ASTFlags>::operator|=
                ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffff80,
                 (bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffff78);
      in_stack_ffffffffffffff70.m_bits = in_stack_ffffffffffffff80.m_bits;
    }
    in_stack_ffffffffffffff80.m_bits = in_stack_ffffffffffffff70.m_bits;
    not_null::operator_cast_to_Type_((not_null<const_slang::ast::Type_*> *)0x60bc65);
    pEVar5 = create(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000028,
                    in_stack_00000008);
    flags.m_bits = (underlying_type)((ulong)pEVar5 >> 0x38);
    selfDetermined(in_RCX,in_RDI);
  }
  bitmask<slang::ast::AssignFlags>::bitmask(&local_91);
  if (op != (_Optional_payload_base<slang::ast::BinaryOperator>)0x0) {
    if ((bVar1 & 1) == 0) {
      if (*(int *)op != 0x4d) {
        bitmask<slang::ast::AssignFlags>::bitmask(&local_93,OutputPort);
        local_91.m_bits = local_93.m_bits;
      }
    }
    else {
      bitmask<slang::ast::AssignFlags>::bitmask(&local_92,InOutPort);
      local_91.m_bits = local_92.m_bits;
    }
  }
  bitmask<slang::ast::ASTFlags>::bitmask(&local_a0,OutputArg);
  bitmask<slang::ast::ASTFlags>::bitmask(&local_a8,NotADriver);
  bVar2 = bitmask<slang::ast::ASTFlags>::has
                    ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffe60.m_bits,
                     (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffe58);
  if (bVar2) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_b0,NotADriver);
    bitmask<slang::ast::ASTFlags>::operator|=(&local_a0,&local_b0);
  }
  local_c0 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_RCX);
  std::optional<slang::ast::BinaryOperator>::optional(&local_c8);
  ASTContext::resetFlags(in_stack_fffffffffffffe58,in_stack_fffffffffffffe60);
  sourceRange.endLoc = SVar3;
  sourceRange.startLoc = SVar4;
  pEVar5 = AssignmentExpression::fromComponents
                     ((Compilation *)in_stack_ffffffffffffff88.m_bits,
                      (optional<slang::ast::BinaryOperator>)op,flags,
                      (Expression *)in_stack_ffffffffffffff80.m_bits,
                      (Expression *)in_stack_ffffffffffffff78.m_bits,in_stack_ffffffffffffffb0,
                      (TimingControl *)in_stack_ffffffffffffff70.m_bits,sourceRange,
                      (ASTContext *)CONCAT17(bVar1,in_stack_ffffffffffffffd0));
  return pEVar5;
}

Assistant:

const Expression& Expression::bindLValue(const ExpressionSyntax& lhs, const Type& rhs,
                                         SourceLocation location, const ASTContext& context,
                                         bool isInout) {
    Compilation& comp = context.getCompilation();

    // Create a placeholder expression that will carry the type of the rhs.
    // Nothing will ever actually look at this expression, it's there only
    // to fill the space in the created AssignmentExpression.
    auto rhsExpr = comp.emplace<EmptyArgumentExpression>(rhs, SourceRange{location, location});

    auto instance = context.getInstance();
    Expression* lhsExpr;
    if (lhs.kind == SyntaxKind::StreamingConcatenationExpression && !isInout &&
        (!instance || instance->arrayPath.empty())) {
        lhsExpr = &selfDetermined(comp, lhs, context,
                                  ASTFlags::StreamingAllowed | ASTFlags::LValue);
    }
    else {
        bitmask<ASTFlags> astFlags = ASTFlags::LValue;
        if (isInout)
            astFlags |= ASTFlags::LAndRValue;

        lhsExpr = &create(comp, lhs, context, astFlags, rhsExpr->type);
        selfDetermined(context, lhsExpr);
    }

    bitmask<AssignFlags> assignFlags;
    if (instance) {
        if (isInout)
            assignFlags = AssignFlags::InOutPort;
        else if (instance->kind != SymbolKind::PrimitiveInstance)
            assignFlags = AssignFlags::OutputPort;
    }

    bitmask<ASTFlags> astFlags = ASTFlags::OutputArg;
    if (context.flags.has(ASTFlags::NotADriver))
        astFlags |= ASTFlags::NotADriver;

    SourceRange lhsRange = lhs.sourceRange();
    return AssignmentExpression::fromComponents(comp, std::nullopt, assignFlags, *lhsExpr, *rhsExpr,
                                                lhsRange, /* timingControl */ nullptr, lhsRange,
                                                context.resetFlags(astFlags));
}